

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_hash_verify(psa_hash_operation_t *operation,uint8_t *hash,size_t hash_length)

{
  int iVar1;
  size_t sStack_70;
  psa_status_t status;
  size_t actual_hash_length;
  uint8_t actual_hash [64];
  size_t hash_length_local;
  uint8_t *hash_local;
  psa_hash_operation_t *operation_local;
  
  actual_hash._56_8_ = hash_length;
  operation_local._4_4_ =
       psa_hash_finish(operation,(uint8_t *)&actual_hash_length,0x40,&stack0xffffffffffffff90);
  if (operation_local._4_4_ == 0) {
    if (sStack_70 == actual_hash._56_8_) {
      iVar1 = safer_memcmp(hash,(uint8_t *)&actual_hash_length,sStack_70);
      if (iVar1 == 0) {
        operation_local._4_4_ = 0;
      }
      else {
        operation_local._4_4_ = -0x95;
      }
    }
    else {
      operation_local._4_4_ = -0x95;
    }
  }
  return operation_local._4_4_;
}

Assistant:

psa_status_t psa_hash_verify( psa_hash_operation_t *operation,
                              const uint8_t *hash,
                              size_t hash_length )
{
    uint8_t actual_hash[MBEDTLS_MD_MAX_SIZE];
    size_t actual_hash_length;
    psa_status_t status = psa_hash_finish( operation,
                                           actual_hash, sizeof( actual_hash ),
                                           &actual_hash_length );
    if( status != PSA_SUCCESS )
        return( status );
    if( actual_hash_length != hash_length )
        return( PSA_ERROR_INVALID_SIGNATURE );
    if( safer_memcmp( hash, actual_hash, actual_hash_length ) != 0 )
        return( PSA_ERROR_INVALID_SIGNATURE );
    return( PSA_SUCCESS );
}